

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateBaseClass.cpp
# Opt level: O2

void __thiscall vkt::DynamicState::DynamicStateBaseClass::initialize(DynamicStateBaseClass *this)

{
  Move<vk::Handle<(vk::HandleType)13>_> *this_00;
  Move<vk::Handle<(vk::HandleType)17>_> *this_01;
  VkFormat _format;
  DeviceInterface *pDVar1;
  VkImage _image;
  Allocation *pAVar2;
  VkAllocationCallbacks *__dest;
  VkAttachmentDescription attachment;
  VkSubpassDescription subpass;
  deUint32 _queueFamilyIndex;
  VkDevice device;
  Allocator *pAVar3;
  long lVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  VkDeviceSize _size;
  byte bVar7;
  VkExtent3D _extent;
  VkAttachmentReference *_colorAttachments;
  undefined4 uVar8;
  undefined4 uVar9;
  VkStructureType VVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 in_stack_fffffffffffffc14;
  undefined8 uVar17;
  undefined4 uVar18;
  undefined4 in_stack_fffffffffffffc24;
  undefined4 uVar19;
  undefined4 in_stack_fffffffffffffc2c;
  VkCommandBufferAllocateInfo cmdBufferAllocateInfo;
  VkVertexInputAttributeDescription vertexInputAttributeDescriptions [2];
  VkAttachmentReference colorAttachmentReference;
  undefined1 local_378 [8];
  VkDeviceMemory VStack_370;
  VkAttachmentReference *local_368;
  VkAllocationCallbacks *pVStack_360;
  VkImageLayout local_358;
  VkSharingMode VStack_354;
  VkVertexInputAttributeDescription *pVStack_350;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_340 [5];
  RefBase<vk::VkCommandBuffer_s_*> local_2c8;
  FramebufferCreateInfo framebufferCreateInfo;
  vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  colorAttachments;
  RenderPassCreateInfo renderPassCreateInfo;
  CmdPoolCreateInfo cmdPoolCreateInfo;
  VkVertexInputBindingDescription vertexInputBindingDescription;
  PipelineLayoutCreateInfo pipelineLayoutCreateInfo;
  ImageCreateInfo targetImageCreateInfo;
  ImageViewCreateInfo colorTargetViewInfo;
  
  bVar7 = 0;
  device = Context::getDevice((this->super_TestInstance).m_context);
  _queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  renderPassCreateInfo.super_VkRenderPassCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassCreateInfo.super_VkRenderPassCreateInfo._4_4_ = 0;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext = (void *)0x0;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.flags = 0;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.attachmentCount = 0;
  Draw::PipelineLayoutCreateInfo::PipelineLayoutCreateInfo
            (&pipelineLayoutCreateInfo,
             (vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
              *)&renderPassCreateInfo,0,(VkPushConstantRange *)0x0);
  std::
  _Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>::
  ~_Vector_base((_Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                 *)&renderPassCreateInfo);
  ::vk::createPipelineLayout
            ((Move<vk::Handle<(vk::HandleType)16>_> *)local_378,this->m_vk,device,
             &pipelineLayoutCreateInfo.super_VkPipelineLayoutCreateInfo,(VkAllocationCallbacks *)0x0
            );
  renderPassCreateInfo.super_VkRenderPassCreateInfo._16_8_ = local_368;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.pAttachments =
       (VkAttachmentDescription *)pVStack_360;
  renderPassCreateInfo.super_VkRenderPassCreateInfo._0_8_ = local_378;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext = (void *)VStack_370.m_internal;
  local_378 = (undefined1  [8])0x0;
  VStack_370.m_internal = 0;
  local_368 = (VkAttachmentReference *)0x0;
  pVStack_360 = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::reset
            (&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>);
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device =
       (VkDevice)renderPassCreateInfo.super_VkRenderPassCreateInfo._16_8_;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)renderPassCreateInfo.super_VkRenderPassCreateInfo.pAttachments;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal =
       renderPassCreateInfo.super_VkRenderPassCreateInfo._0_8_;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_378);
  uVar19 = 0;
  uVar18 = 0;
  uVar17 = 0;
  uVar16 = 0;
  _extent.depth = 1;
  _extent.width = 0x80;
  _extent.height = 0x80;
  Draw::ImageCreateInfo::ImageCreateInfo
            (&targetImageCreateInfo,VK_IMAGE_TYPE_2D,this->m_colorAttachmentFormat,_extent,1,1,
             VK_SAMPLE_COUNT_1_BIT,VK_IMAGE_TILING_OPTIMAL,0x13,VK_SHARING_MODE_EXCLUSIVE,0,
             (deUint32 *)0x0,0,VK_IMAGE_LAYOUT_UNDEFINED);
  pDVar1 = this->m_vk;
  pAVar3 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  Draw::Image::createAndAlloc
            ((Image *)&renderPassCreateInfo,pDVar1,device,
             &targetImageCreateInfo.super_VkImageCreateInfo,pAVar3,(MemoryRequirement)0x0);
  de::SharedPtr<vkt::Draw::Image>::operator=
            (&this->m_colorTargetImage,(SharedPtr<vkt::Draw::Image> *)&renderPassCreateInfo);
  de::SharedPtr<vkt::Draw::Image>::~SharedPtr((SharedPtr<vkt::Draw::Image> *)&renderPassCreateInfo);
  _image.m_internal =
       (((this->m_colorTargetImage).m_ptr)->m_object).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
       m_data.object.m_internal;
  _format = this->m_colorAttachmentFormat;
  Draw::ComponentMapping::ComponentMapping
            ((ComponentMapping *)&renderPassCreateInfo,VK_COMPONENT_SWIZZLE_R,VK_COMPONENT_SWIZZLE_G
             ,VK_COMPONENT_SWIZZLE_B,VK_COMPONENT_SWIZZLE_A);
  Draw::ImageViewCreateInfo::ImageViewCreateInfo
            (&colorTargetViewInfo,_image,VK_IMAGE_VIEW_TYPE_2D,_format,
             (VkComponentMapping *)&renderPassCreateInfo,0);
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)local_378,this->m_vk,device,
             &colorTargetViewInfo.super_VkImageViewCreateInfo,(VkAllocationCallbacks *)0x0);
  renderPassCreateInfo.super_VkRenderPassCreateInfo._16_8_ = local_368;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.pAttachments =
       (VkAttachmentDescription *)pVStack_360;
  renderPassCreateInfo.super_VkRenderPassCreateInfo._0_8_ = local_378;
  renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext = (void *)VStack_370.m_internal;
  local_378 = (undefined1  [8])0x0;
  VStack_370.m_internal = 0;
  local_368 = (VkAttachmentReference *)0x0;
  pVStack_360 = (VkAllocationCallbacks *)0x0;
  this_00 = &this->m_colorTargetView;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::reset
            (&this_00->super_RefBase<vk::Handle<(vk::HandleType)13>_>);
  (this->m_colorTargetView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
       (VkDevice)renderPassCreateInfo.super_VkRenderPassCreateInfo._16_8_;
  (this->m_colorTargetView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)
                renderPassCreateInfo.super_VkRenderPassCreateInfo.pAttachments;
  (this_00->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
       renderPassCreateInfo.super_VkRenderPassCreateInfo._0_8_;
  (this->m_colorTargetView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)renderPassCreateInfo.super_VkRenderPassCreateInfo.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)13>_> *)local_378);
  Draw::RenderPassCreateInfo::RenderPassCreateInfo
            (&renderPassCreateInfo,0,(VkAttachmentDescription *)0x0,0,(VkSubpassDescription *)0x0,0,
             (VkSubpassDependency *)0x0);
  Draw::AttachmentDescription::AttachmentDescription
            ((AttachmentDescription *)local_378,this->m_colorAttachmentFormat,VK_SAMPLE_COUNT_1_BIT,
             VK_ATTACHMENT_LOAD_OP_LOAD,VK_ATTACHMENT_STORE_OP_STORE,VK_ATTACHMENT_LOAD_OP_DONT_CARE
             ,VK_ATTACHMENT_STORE_OP_STORE,VK_IMAGE_LAYOUT_GENERAL,VK_IMAGE_LAYOUT_GENERAL);
  uVar13 = (undefined4)((ulong)pVStack_360 >> 0x20);
  attachment.samples = (int)VStack_370.m_internal;
  attachment.flags = local_378._0_4_;
  attachment.format = local_378._4_4_;
  attachment.loadOp = (int)(VStack_370.m_internal >> 0x20);
  attachment.storeOp = (int)local_368;
  attachment.stencilLoadOp = (int)((ulong)local_368 >> 0x20);
  attachment.stencilStoreOp = (int)pVStack_360;
  attachment.initialLayout = uVar13;
  attachment.finalLayout = local_358;
  Draw::RenderPassCreateInfo::addAttachment(&renderPassCreateInfo,attachment);
  colorAttachmentReference.attachment = 0;
  colorAttachmentReference.layout = VK_IMAGE_LAYOUT_GENERAL;
  Draw::AttachmentReference::AttachmentReference((AttachmentReference *)&framebufferCreateInfo);
  VVar10 = framebufferCreateInfo.super_VkFramebufferCreateInfo.sType;
  uVar11 = framebufferCreateInfo.super_VkFramebufferCreateInfo._4_4_;
  uVar14 = 0;
  uVar15 = 0;
  _colorAttachments = &colorAttachmentReference;
  uVar12 = 0;
  uVar8 = 0;
  uVar9 = 0;
  Draw::SubpassDescription::SubpassDescription
            ((SubpassDescription *)local_378,VK_PIPELINE_BIND_POINT_GRAPHICS,0,0,
             (VkAttachmentReference *)0x0,1,_colorAttachments,(VkAttachmentReference *)0x0,
             (VkAttachmentReference)framebufferCreateInfo.super_VkFramebufferCreateInfo._0_8_,0,
             (deUint32 *)0x0);
  puVar5 = (undefined8 *)local_378;
  puVar6 = (undefined8 *)&stack0xfffffffffffffbe8;
  for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar6 = *puVar5;
    puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
    puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
  }
  subpass.inputAttachmentCount = uVar8;
  subpass._0_8_ = _colorAttachments;
  subpass._12_4_ = uVar9;
  subpass.pInputAttachments._0_4_ = VVar10;
  subpass.pInputAttachments._4_4_ = uVar11;
  subpass.colorAttachmentCount = uVar12;
  subpass._28_4_ = uVar13;
  subpass.pColorAttachments._0_4_ = uVar14;
  subpass.pColorAttachments._4_4_ = uVar15;
  subpass.pResolveAttachments._0_4_ = uVar16;
  subpass.pResolveAttachments._4_4_ = in_stack_fffffffffffffc14;
  subpass.pDepthStencilAttachment = (VkAttachmentReference *)uVar17;
  subpass.preserveAttachmentCount = uVar18;
  subpass._60_4_ = in_stack_fffffffffffffc24;
  subpass.pPreserveAttachments._0_4_ = uVar19;
  subpass.pPreserveAttachments._4_4_ = in_stack_fffffffffffffc2c;
  Draw::RenderPassCreateInfo::addSubpass(&renderPassCreateInfo,subpass);
  Draw::SubpassDescription::~SubpassDescription((SubpassDescription *)local_378);
  ::vk::createRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&framebufferCreateInfo,this->m_vk,device,
             &renderPassCreateInfo.super_VkRenderPassCreateInfo,(VkAllocationCallbacks *)0x0);
  local_368 = (VkAttachmentReference *)framebufferCreateInfo.super_VkFramebufferCreateInfo._16_8_;
  pVStack_360 = (VkAllocationCallbacks *)
                framebufferCreateInfo.super_VkFramebufferCreateInfo.renderPass.m_internal;
  local_378 = (undefined1  [8])framebufferCreateInfo.super_VkFramebufferCreateInfo._0_8_;
  VStack_370.m_internal = (deUint64)framebufferCreateInfo.super_VkFramebufferCreateInfo.pNext;
  framebufferCreateInfo.super_VkFramebufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  framebufferCreateInfo.super_VkFramebufferCreateInfo._4_4_ = 0;
  framebufferCreateInfo.super_VkFramebufferCreateInfo.pNext = (void *)0x0;
  framebufferCreateInfo.super_VkFramebufferCreateInfo.flags = 0;
  framebufferCreateInfo.super_VkFramebufferCreateInfo._20_4_ = 0;
  framebufferCreateInfo.super_VkFramebufferCreateInfo.renderPass.m_internal = 0;
  this_01 = &this->m_renderPass;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::reset
            (&this_01->super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
       (VkDevice)local_368;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       pVStack_360;
  (this_01->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal =
       (deUint64)local_378;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)VStack_370.m_internal;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)17>_> *)&framebufferCreateInfo);
  std::vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
  vector(&colorAttachments,1,(allocator_type *)local_378);
  (colorAttachments.
   super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
   ._M_impl.super__Vector_impl_data._M_start)->m_internal =
       (this_00->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
  Draw::FramebufferCreateInfo::FramebufferCreateInfo
            (&framebufferCreateInfo,
             (VkRenderPass)
             (this_01->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal,
             &colorAttachments,0x80,0x80,1);
  ::vk::createFramebuffer
            ((Move<vk::Handle<(vk::HandleType)23>_> *)vertexInputAttributeDescriptions,this->m_vk,
             device,&framebufferCreateInfo.super_VkFramebufferCreateInfo,
             (VkAllocationCallbacks *)0x0);
  local_368 = (VkAttachmentReference *)vertexInputAttributeDescriptions[1]._0_8_;
  pVStack_360 = (VkAllocationCallbacks *)vertexInputAttributeDescriptions[1]._8_8_;
  local_378._0_4_ = vertexInputAttributeDescriptions[0].location;
  local_378._4_4_ = vertexInputAttributeDescriptions[0].binding;
  VStack_370.m_internal._0_4_ = vertexInputAttributeDescriptions[0].format;
  VStack_370.m_internal._4_4_ = vertexInputAttributeDescriptions[0].offset;
  vertexInputAttributeDescriptions[0].location = 0;
  vertexInputAttributeDescriptions[0].binding = 0;
  vertexInputAttributeDescriptions[0].format = VK_FORMAT_UNDEFINED;
  vertexInputAttributeDescriptions[0].offset = 0;
  vertexInputAttributeDescriptions[1].location = 0;
  vertexInputAttributeDescriptions[1].binding = 0;
  vertexInputAttributeDescriptions[1].format = VK_FORMAT_UNDEFINED;
  vertexInputAttributeDescriptions[1].offset = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::reset
            (&(this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>);
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
       (VkDevice)local_368;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       pVStack_360;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
       (deUint64)local_378;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)VStack_370.m_internal;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)23>_> *)vertexInputAttributeDescriptions);
  vertexInputBindingDescription.binding = 0;
  vertexInputBindingDescription.stride = 0x20;
  vertexInputBindingDescription.inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
  vertexInputAttributeDescriptions[1].location = 1;
  vertexInputAttributeDescriptions[1].binding = 0;
  vertexInputAttributeDescriptions[1].format = VK_FORMAT_R32G32B32A32_SFLOAT;
  vertexInputAttributeDescriptions[1].offset = 0x10;
  vertexInputAttributeDescriptions[0].location = 0;
  vertexInputAttributeDescriptions[0].binding = 0;
  vertexInputAttributeDescriptions[0].format = VK_FORMAT_R32G32B32A32_SFLOAT;
  vertexInputAttributeDescriptions[0].offset = 0;
  Draw::PipelineCreateInfo::VertexInputState::VertexInputState
            ((VertexInputState *)local_378,1,&vertexInputBindingDescription,2,
             vertexInputAttributeDescriptions);
  *(ulong *)&(this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.
             vertexAttributeDescriptionCount = CONCAT44(VStack_354,local_358);
  (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.pVertexAttributeDescriptions
       = pVStack_350;
  *(VkAttachmentReference **)
   &(this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.flags = local_368;
  (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.pVertexBindingDescriptions =
       (VkVertexInputBindingDescription *)pVStack_360;
  *(undefined1 (*) [8])&(this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo =
       local_378;
  (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.pNext =
       (void *)VStack_370.m_internal;
  _size = (long)(this->m_data).
                super__Vector_base<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_data).
                super__Vector_base<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
                ._M_impl.super__Vector_impl_data._M_start;
  pDVar1 = this->m_vk;
  Draw::BufferCreateInfo::BufferCreateInfo
            ((BufferCreateInfo *)local_378,_size,0x80,VK_SHARING_MODE_EXCLUSIVE,0,(deUint32 *)0x0,0)
  ;
  pAVar3 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  Draw::Buffer::createAndAlloc
            ((Buffer *)&cmdBufferAllocateInfo,pDVar1,device,(VkBufferCreateInfo *)local_378,pAVar3,
             (MemoryRequirement)0x1);
  de::SharedPtr<vkt::Draw::Buffer>::operator=
            (&this->m_vertexBuffer,(SharedPtr<vkt::Draw::Buffer> *)&cmdBufferAllocateInfo);
  de::SharedPtr<vkt::Draw::Buffer>::release((SharedPtr<vkt::Draw::Buffer> *)&cmdBufferAllocateInfo);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(local_340);
  pAVar2 = (((this->m_vertexBuffer).m_ptr)->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  local_378 = (undefined1  [8])&PTR__Allocation_00c234b8;
  VStack_370.m_internal = (pAVar2->m_memory).m_internal;
  local_368 = (VkAttachmentReference *)pAVar2->m_offset;
  __dest = (VkAllocationCallbacks *)pAVar2->m_hostPtr;
  pVStack_360 = __dest;
  ::vk::Allocation::~Allocation((Allocation *)local_378);
  memcpy(__dest,(this->m_data).
                super__Vector_base<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
                ._M_impl.super__Vector_impl_data._M_start,_size);
  pAVar2 = (((this->m_vertexBuffer).m_ptr)->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  local_378 = (undefined1  [8])&PTR__Allocation_00c234b8;
  VStack_370.m_internal = (pAVar2->m_memory).m_internal;
  local_368 = (VkAttachmentReference *)pAVar2->m_offset;
  pVStack_360 = (VkAllocationCallbacks *)pAVar2->m_hostPtr;
  cmdBufferAllocateInfo._0_8_ = &PTR__Allocation_00c234b8;
  cmdBufferAllocateInfo.pNext = (void *)(pAVar2->m_memory).m_internal;
  cmdBufferAllocateInfo.commandPool.m_internal = pAVar2->m_offset;
  cmdBufferAllocateInfo._24_8_ = pAVar2->m_hostPtr;
  ::vk::flushMappedMemoryRange
            (this->m_vk,device,VStack_370,cmdBufferAllocateInfo.commandPool.m_internal,_size);
  ::vk::Allocation::~Allocation((Allocation *)&cmdBufferAllocateInfo);
  ::vk::Allocation::~Allocation((Allocation *)local_378);
  Draw::CmdPoolCreateInfo::CmdPoolCreateInfo(&cmdPoolCreateInfo,_queueFamilyIndex,2);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&cmdBufferAllocateInfo,this->m_vk,device,
             &cmdPoolCreateInfo.super_VkCommandPoolCreateInfo,(VkAllocationCallbacks *)0x0);
  local_368 = (VkAttachmentReference *)cmdBufferAllocateInfo.commandPool.m_internal;
  pVStack_360 = (VkAllocationCallbacks *)cmdBufferAllocateInfo._24_8_;
  local_378 = (undefined1  [8])cmdBufferAllocateInfo._0_8_;
  VStack_370.m_internal = (deUint64)cmdBufferAllocateInfo.pNext;
  cmdBufferAllocateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  cmdBufferAllocateInfo._4_4_ = 0;
  cmdBufferAllocateInfo.pNext = (void *)0x0;
  cmdBufferAllocateInfo.commandPool.m_internal = 0;
  cmdBufferAllocateInfo.level = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
  cmdBufferAllocateInfo.commandBufferCount = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::reset
            (&(this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>);
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
       (VkDevice)local_368;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       pVStack_360;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
       (deUint64)local_378;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)VStack_370.m_internal;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&cmdBufferAllocateInfo);
  cmdBufferAllocateInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
  cmdBufferAllocateInfo.pNext = (void *)0x0;
  cmdBufferAllocateInfo.commandPool.m_internal =
       (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  cmdBufferAllocateInfo.level = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
  cmdBufferAllocateInfo.commandBufferCount = 1;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&local_2c8,this->m_vk,device,&cmdBufferAllocateInfo);
  local_368 = (VkAttachmentReference *)local_2c8.m_data.deleter.m_device;
  pVStack_360 = (VkAllocationCallbacks *)local_2c8.m_data.deleter.m_pool.m_internal;
  local_378 = (undefined1  [8])local_2c8.m_data.object;
  VStack_370.m_internal = (deUint64)local_2c8.m_data.deleter.m_deviceIface;
  local_2c8.m_data.object = (VkCommandBuffer_s *)0x0;
  local_2c8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_2c8.m_data.deleter.m_device = (VkDevice)0x0;
  local_2c8.m_data.deleter.m_pool.m_internal = 0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::reset
            (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device =
       (VkDevice)local_368;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal =
       (deUint64)pVStack_360;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
       (VkCommandBuffer_s *)local_378;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)VStack_370.m_internal;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_2c8);
  (*(this->super_TestInstance)._vptr_TestInstance[3])(this,device);
  std::
  _Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
  ~_Vector_base(&colorAttachments.
                 super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
               );
  Draw::RenderPassCreateInfo::~RenderPassCreateInfo(&renderPassCreateInfo);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&targetImageCreateInfo.m_queueFamilyIndices.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  Draw::PipelineLayoutCreateInfo::~PipelineLayoutCreateInfo(&pipelineLayoutCreateInfo);
  return;
}

Assistant:

void DynamicStateBaseClass::initialize (void)
{
	const vk::VkDevice device		= m_context.getDevice();
	const deUint32 queueFamilyIndex = m_context.getUniversalQueueFamilyIndex();

	const PipelineLayoutCreateInfo pipelineLayoutCreateInfo;
	m_pipelineLayout = vk::createPipelineLayout(m_vk, device, &pipelineLayoutCreateInfo);

	const vk::VkExtent3D targetImageExtent = { WIDTH, HEIGHT, 1 };
	const ImageCreateInfo targetImageCreateInfo(vk::VK_IMAGE_TYPE_2D, m_colorAttachmentFormat, targetImageExtent, 1, 1, vk::VK_SAMPLE_COUNT_1_BIT,
												vk::VK_IMAGE_TILING_OPTIMAL, vk::VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | vk::VK_IMAGE_USAGE_TRANSFER_SRC_BIT | vk::VK_IMAGE_USAGE_TRANSFER_DST_BIT);

	m_colorTargetImage = Image::createAndAlloc(m_vk, device, targetImageCreateInfo, m_context.getDefaultAllocator());

	const ImageViewCreateInfo colorTargetViewInfo(m_colorTargetImage->object(), vk::VK_IMAGE_VIEW_TYPE_2D, m_colorAttachmentFormat);
	m_colorTargetView = vk::createImageView(m_vk, device, &colorTargetViewInfo);

	RenderPassCreateInfo renderPassCreateInfo;
	renderPassCreateInfo.addAttachment(AttachmentDescription(m_colorAttachmentFormat,
															 vk::VK_SAMPLE_COUNT_1_BIT,
															 vk::VK_ATTACHMENT_LOAD_OP_LOAD,
															 vk::VK_ATTACHMENT_STORE_OP_STORE,
															 vk::VK_ATTACHMENT_LOAD_OP_DONT_CARE,
															 vk::VK_ATTACHMENT_STORE_OP_STORE,
															 vk::VK_IMAGE_LAYOUT_GENERAL,
															 vk::VK_IMAGE_LAYOUT_GENERAL));

	const vk::VkAttachmentReference colorAttachmentReference =
	{
		0,
		vk::VK_IMAGE_LAYOUT_GENERAL
	};

	renderPassCreateInfo.addSubpass(SubpassDescription(
		vk::VK_PIPELINE_BIND_POINT_GRAPHICS,
		0,
		0,
		DE_NULL,
		1,
		&colorAttachmentReference,
		DE_NULL,
		AttachmentReference(),
		0,
		DE_NULL
		)
		);

	m_renderPass = vk::createRenderPass(m_vk, device, &renderPassCreateInfo);

	std::vector<vk::VkImageView> colorAttachments(1);
	colorAttachments[0] = *m_colorTargetView;

	const FramebufferCreateInfo framebufferCreateInfo(*m_renderPass, colorAttachments, WIDTH, HEIGHT, 1);

	m_framebuffer = vk::createFramebuffer(m_vk, device, &framebufferCreateInfo);

	const vk::VkVertexInputBindingDescription vertexInputBindingDescription =
	{
		0,
		(deUint32)sizeof(tcu::Vec4) * 2,
		vk::VK_VERTEX_INPUT_RATE_VERTEX,
	};

	const vk::VkVertexInputAttributeDescription vertexInputAttributeDescriptions[2] =
	{
		{
			0u,
			0u,
			vk::VK_FORMAT_R32G32B32A32_SFLOAT,
			0u
		},
		{
			1u,
			0u,
			vk::VK_FORMAT_R32G32B32A32_SFLOAT,
			(deUint32)(sizeof(float)* 4),
		}
	};

	m_vertexInputState = PipelineCreateInfo::VertexInputState(
		1,
		&vertexInputBindingDescription,
		2,
		vertexInputAttributeDescriptions);

	const vk::VkDeviceSize dataSize = m_data.size() * sizeof(PositionColorVertex);
	m_vertexBuffer = Buffer::createAndAlloc(m_vk, device, BufferCreateInfo(dataSize, vk::VK_BUFFER_USAGE_VERTEX_BUFFER_BIT),
											m_context.getDefaultAllocator(), vk::MemoryRequirement::HostVisible);

	deUint8* ptr = reinterpret_cast<unsigned char *>(m_vertexBuffer->getBoundMemory().getHostPtr());
	deMemcpy(ptr, &m_data[0], (size_t)dataSize);

	vk::flushMappedMemoryRange(m_vk, device,
		m_vertexBuffer->getBoundMemory().getMemory(),
		m_vertexBuffer->getBoundMemory().getOffset(),
		dataSize);

	const CmdPoolCreateInfo cmdPoolCreateInfo(queueFamilyIndex);
	m_cmdPool = vk::createCommandPool(m_vk, device, &cmdPoolCreateInfo);

	const vk::VkCommandBufferAllocateInfo cmdBufferAllocateInfo =
	{
		vk::VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO,	// VkStructureType			sType;
		DE_NULL,											// const void*				pNext;
		*m_cmdPool,											// VkCommandPool			commandPool;
		vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY,				// VkCommandBufferLevel		level;
		1u,													// deUint32					bufferCount;
	};
	m_cmdBuffer = vk::allocateCommandBuffer(m_vk, device, &cmdBufferAllocateInfo);

	initPipeline(device);
}